

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O1

ktx_error_code_e ktxTexture2_DeflateZLIB(ktxTexture2 *This,ktx_uint32_t compressionLevel)

{
  ktx_uint32_t kVar1;
  ktxTexture2_private *pkVar2;
  bool bVar3;
  ktxTexture2 *pkVar4;
  uint uVar5;
  ktx_error_code_e kVar6;
  ktx_size_t kVar7;
  void *__ptr;
  ulong uVar8;
  ktx_uint8_t *__dest;
  ktxLevelIndexEntry *__dest_00;
  ktx_size_t kVar9;
  ktx_uint64_t *pkVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  size_t levelByteLengthCmp;
  ktx_error_code_e local_60;
  size_t local_58;
  ktx_size_t local_48;
  ulong local_40;
  ktxTexture2 *local_38;
  
  kVar6 = KTX_INVALID_OPERATION;
  if (This->supercompressionScheme == KTX_SS_BEGIN_RANGE) {
    kVar1 = This->numLevels;
    pkVar2 = This->_private;
    uVar5 = kVar1 - 1;
    if ((int)uVar5 < 0) {
      kVar9 = 0;
    }
    else {
      pkVar10 = &pkVar2->_levelIndex[uVar5].byteLength;
      kVar9 = 0;
      lVar11 = (ulong)uVar5 + 1;
      do {
        kVar7 = ktxCompressZLIBBounds(*pkVar10);
        kVar9 = kVar9 + kVar7;
        pkVar10 = pkVar10 + -3;
        lVar12 = lVar11 + -1;
        bVar3 = 0 < lVar11;
        lVar11 = lVar12;
      } while (lVar12 != 0 && bVar3);
    }
    uVar13 = (ulong)(kVar1 * 0x18);
    __ptr = malloc(kVar9 + uVar13);
    kVar6 = KTX_OUT_OF_MEMORY;
    if (__ptr != (void *)0x0) {
      __dest_00 = pkVar2->_levelIndex;
      uVar5 = This->numLevels;
      lVar11 = 0;
      local_58 = 0;
      local_40 = uVar13;
      local_38 = This;
      while (uVar5 = uVar5 - 1, -1 < (int)uVar5) {
        uVar8 = (ulong)(uVar5 & 0x7fffffff);
        local_48 = kVar9;
        kVar6 = ktxCompressZLIBInt((uchar *)((long)((long)__ptr + uVar13) + lVar11),&local_48,
                                   local_38->pData + __dest_00[uVar8].byteOffset,
                                   pkVar2->_levelIndex[uVar8].byteLength,compressionLevel);
        if (kVar6 != KTX_SUCCESS) {
          free(__ptr);
          local_60 = kVar6;
          break;
        }
        *(long *)((long)__ptr + uVar8 * 0x18) = lVar11;
        *(ktx_uint64_t *)((long)__ptr + uVar8 * 0x18 + 0x10) = __dest_00[uVar8].byteLength;
        *(ktx_size_t *)((long)__ptr + uVar8 * 0x18 + 8) = local_48;
        local_58 = local_58 + local_48;
        lVar11 = lVar11 + local_48;
        kVar9 = kVar9 - local_48;
      }
      pkVar4 = local_38;
      kVar6 = local_60;
      if ((int)uVar5 < 0) {
        __dest = (ktx_uint8_t *)malloc(local_58);
        if (__dest == (ktx_uint8_t *)0x0) {
          free(__ptr);
          kVar6 = KTX_OUT_OF_MEMORY;
        }
        else {
          memcpy(__dest,(void *)((long)__ptr + uVar13),local_58);
          memcpy(__dest_00,__ptr,local_40);
          free(__ptr);
          free(pkVar4->pData);
          pkVar4->pData = __dest;
          pkVar4->dataSize = local_58;
          pkVar4->supercompressionScheme = KTX_SS_END_RANGE;
          pkVar4->_private->_requiredLevelAlignment = 1;
          kVar6 = KTX_SUCCESS;
        }
      }
    }
  }
  return kVar6;
}

Assistant:

KTX_error_code
ktxTexture2_DeflateZLIB(ktxTexture2* This, ktx_uint32_t compressionLevel)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    ktx_uint8_t* workBuf;
    ktx_uint8_t* cmpData;
    ktx_size_t dstRemainingByteLength = 0;
    ktx_size_t byteLengthCmp = 0;
    ktx_size_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint8_t* pCmpDst;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    // On rare occasions the deflated data can be a few bytes larger than
    // the source data. Calculating the dst buffer size using
    // mz_deflateBound provides a conservative size to account for that.
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        dstRemainingByteLength += ktxCompressZLIBBounds(cindex[level].byteLength);
    }

    workBuf = malloc(dstRemainingByteLength + levelIndexByteLength);
    if (workBuf == NULL)
        return KTX_OUT_OF_MEMORY;
    nindex = (ktxLevelIndexEntry*)workBuf;
    pCmpDst = &workBuf[levelIndexByteLength];

    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLengthCmp = dstRemainingByteLength;
        KTX_error_code result = ktxCompressZLIBInt(pCmpDst + levelOffset,
                                                    &levelByteLengthCmp,
                                                    &This->pData[cindex[level].byteOffset],
                                                    cindex[level].byteLength,
                                                    compressionLevel);
        if (result != KTX_SUCCESS) {
            free(workBuf);
            return result;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = cindex[level].byteLength;
        nindex[level].byteLength = levelByteLengthCmp;
        byteLengthCmp += levelByteLengthCmp;
        levelOffset += levelByteLengthCmp;
        dstRemainingByteLength -= levelByteLengthCmp;
    }

    // Move the compressed data into a correctly sized buffer.
    cmpData = malloc(byteLengthCmp);
    if (cmpData == NULL) {
        free(workBuf);
        return KTX_OUT_OF_MEMORY;
    }
    // Now modify the texture.
    memcpy(cmpData, pCmpDst, byteLengthCmp); // Copy data to sized buffer.
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(workBuf);
    free(This->pData);
    This->pData = cmpData;
    This->dataSize = byteLengthCmp;
    This->supercompressionScheme = KTX_SS_ZLIB;
    This->_private->_requiredLevelAlignment = 1;

    return KTX_SUCCESS;
}